

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.cpp
# Opt level: O2

void event_track::write_event_track_cmaf_header(uint32_t track_id,uint32_t timescale,ostream *ot)

{
  uint uVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sparse_moov;
  
  base64_decode(&sparse_moov,&moov_64_enc_abi_cxx11_);
  fmp4_stream::set_track_id(&sparse_moov,track_id);
  uVar1 = timescale >> 0x18 | (timescale & 0xff0000) >> 8 | (timescale & 0xff00) << 8 |
          timescale << 0x18;
  *(uint *)(sparse_moov.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start + 0x1c) = uVar1;
  *(uint *)(sparse_moov.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start + 0xf4) = uVar1;
  *(uint32_t *)
   (sparse_moov.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start + 0x220) =
       track_id >> 0x18 | (track_id & 0xff0000) >> 8 | (track_id & 0xff00) << 8 | track_id << 0x18;
  set_evte(&sparse_moov);
  if (*(int *)(ot + *(long *)(*(long *)ot + -0x18) + 0x20) == 0) {
    std::ostream::write((char *)ot,0x110a00);
    std::ostream::write((char *)ot,
                        (long)sparse_moov.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&sparse_moov.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

void event_track::write_event_track_cmaf_header(uint32_t track_id, uint32_t timescale, std::ostream &ot)
{
	std::vector<uint8_t> sparse_moov = base64_decode(moov_64_enc);
	set_track_id(sparse_moov, track_id);

	// write back the timescale mvhd / mhd
	fmp4_write_uint32(timescale, (char*) &sparse_moov[28]);
	fmp4_write_uint32(timescale, (char*) &sparse_moov[244]);
	fmp4_write_uint32(track_id,  (char*)  &sparse_moov[544]);
	event_track::set_evte(sparse_moov);

	if (ot.good())
	{
		// write the ftyp header
		ot.write((char*)&sparse_ftyp[0], 20);
		ot.write((const char*)&sparse_moov[0], sparse_moov.size());
	}
	
	return;
}